

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O0

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::UnChain(StringBuilder<Memory::ArenaAllocator> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Data *pBuf;
  Data *newChunk;
  StringBuilder<Memory::ArenaAllocator> *pSStack_10;
  charcount_t newLength;
  StringBuilder<Memory::ArenaAllocator> *this_local;
  
  pSStack_10 = this;
  bVar2 = IsChained(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x100,"(this->IsChained())","this->IsChained()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  newChunk._4_4_ = this->count;
  pBuf = NewSingleChunk(this,(charcount_t *)((long)&newChunk + 4));
  this->length = newChunk._4_4_;
  UnChain(this,(char16 *)pBuf,newChunk._4_4_);
  this->lastChunk = pBuf;
  this->firstChunk = pBuf;
  this->secondChunk = (Data *)0x0;
  this->appendPtr = (char16 *)((long)&pBuf->u + (ulong)this->count * 2);
  return;
}

Assistant:

void UnChain()
        {
            Assert(this->IsChained());

            charcount_t newLength = this->count;

            Data *newChunk = this->NewSingleChunk(&newLength);

            this->length = newLength;

            this->UnChain(newChunk->u.single.buffer, newLength);

            this->firstChunk = this->lastChunk = newChunk;
            this->secondChunk = NULL;
            this->appendPtr = newChunk->u.single.buffer + this->count;
        }